

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elftool.cpp
# Opt level: O2

void printSectionHeaders(ElfImage *image)

{
  size_t sVar1;
  uint64_t uVar2;
  iterator iVar3;
  iterator iVar4;
  string *psVar5;
  uint uVar6;
  
  sVar1 = libelfxx::ElfImage::sectionNum(image);
  uVar2 = libelfxx::ElfImage::phoff(image);
  printf("There are %zu section headers, starting at offset 0x%lx:\n\n",sVar1,uVar2);
  puts("Section Headers:");
  puts("  [Nr] Name              Type            Addr     Off    Size   ES Flg Lk Inf Al");
  iVar3 = libelfxx::ElfImage::begin(image);
  iVar4 = libelfxx::ElfImage::end(image);
  uVar6 = 0;
  for (; iVar3._M_current != iVar4._M_current; iVar3._M_current = iVar3._M_current + 1) {
    psVar5 = libelfxx::ElfSection::name_abi_cxx11_(*iVar3._M_current);
    printf("  [%2u] %s\n",(ulong)uVar6,(psVar5->_M_dataplus)._M_p);
    uVar6 = uVar6 + 1;
  }
  puts(
      "Key to Flags:\n  W (write), A (alloc), X (execute), M (merge), S (strings)\n  I (info), L (link order), G (group), T (TLS), E (exclude), x (unknown)\n  O (extra OS processing required) o (OS specific), p (processor specific)"
      );
  return;
}

Assistant:

static void
printSectionHeaders(libelfxx::ElfImage *image) {
  printf("There are %zu section headers, starting at offset 0x%" PRIx64 ":\n\n",
         image->sectionNum(), image->phoff());
  printf("Section Headers:\n");
  printf("  [Nr] Name              Type            Addr     Off    Size"
         "   ES Flg Lk Inf Al\n");
  unsigned i = 0;
  for (auto section : *image) {
    printf("  [%2u] %s\n", i++, section->name().c_str());
  }
  printf("Key to Flags:\n"
         "  W (write), A (alloc), X (execute), M (merge), S (strings)\n"
         "  I (info), L (link order), G (group), T (TLS), E (exclude),"
         " x (unknown)\n"
         "  O (extra OS processing required) o (OS specific),"
         " p (processor specific)\n");
}